

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

string * __thiscall re2::Prog::Inst::Dump_abi_cxx11_(string *__return_storage_ptr__,Inst *this)

{
  byte bVar1;
  byte bVar2;
  InstOp IVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  Inst *this_local;
  
  IVar3 = opcode(this);
  switch(IVar3) {
  case kInstAlt:
    uVar6 = out(this);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"alt -> %d | %d",(ulong)uVar6,(ulong)(this->field_1).out1_);
    break;
  case kInstAltMatch:
    uVar6 = out(this);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"altmatch -> %d | %d",(ulong)uVar6,
               (ulong)(this->field_1).out1_);
    break;
  case kInstByteRange:
    iVar4 = foldcase(this);
    pcVar7 = "";
    if (iVar4 != 0) {
      pcVar7 = "/i";
    }
    bVar1 = (this->field_1).field_3.lo_;
    bVar2 = (this->field_1).field_3.hi_;
    uVar6 = hint(this);
    iVar4 = out(this);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"byte%s [%02x-%02x] %d -> %d",pcVar7,(ulong)bVar1,(ulong)bVar2
               ,(ulong)uVar6,iVar4);
    break;
  case kInstCapture:
    uVar6 = (this->field_1).out1_;
    uVar5 = out(this);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"capture %d -> %d",(ulong)uVar6,(ulong)uVar5);
    break;
  case kInstEmptyWidth:
    uVar6 = (this->field_1).out1_;
    uVar5 = out(this);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"emptywidth %#x -> %d",(ulong)uVar6,(ulong)uVar5)
    ;
    break;
  case kInstMatch:
    uVar6 = match_id(this);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"match! %d",(ulong)uVar6);
    break;
  case kInstNop:
    uVar6 = out(this);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"nop -> %d",(ulong)uVar6);
    break;
  case kInstFail:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"fail");
    break;
  default:
    IVar3 = opcode(this);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"opcode %d",(ulong)IVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Prog::Inst::Dump() {
  switch (opcode()) {
    default:
      return StringPrintf("opcode %d", static_cast<int>(opcode()));

    case kInstAlt:
      return StringPrintf("alt -> %d | %d", out(), out1_);

    case kInstAltMatch:
      return StringPrintf("altmatch -> %d | %d", out(), out1_);

    case kInstByteRange:
      return StringPrintf("byte%s [%02x-%02x] %d -> %d",
                          foldcase() ? "/i" : "",
                          lo_, hi_, hint(), out());

    case kInstCapture:
      return StringPrintf("capture %d -> %d", cap_, out());

    case kInstEmptyWidth:
      return StringPrintf("emptywidth %#x -> %d",
                          static_cast<int>(empty_), out());

    case kInstMatch:
      return StringPrintf("match! %d", match_id());

    case kInstNop:
      return StringPrintf("nop -> %d", out());

    case kInstFail:
      return StringPrintf("fail");
  }
}